

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::render_four(Entity *this,ALLEGRO_COLOR tint)

{
  uint uVar1;
  uint uVar2;
  float local_48;
  float local_38;
  
  (*this->_vptr_Entity[2])(this,0,0);
  uVar1 = -BB_W;
  if (this->x <= (float)(BB_W / 2)) {
    uVar1 = BB_W;
  }
  local_48 = tint.r;
  local_38 = tint.b;
  (*this->_vptr_Entity[2])(local_48,local_38,this,(ulong)uVar1,0);
  if (this->y <= (float)(BB_H / 2)) {
    (*this->_vptr_Entity[2])(local_48,local_38,this,0,(ulong)(uint)BB_H);
    uVar2 = BB_H;
  }
  else {
    (*this->_vptr_Entity[2])(local_48,local_38,this,0,(ulong)(uint)-BB_H);
    uVar2 = -BB_H;
  }
  (*this->_vptr_Entity[2])(local_48,local_38,this,(ulong)uVar1,(ulong)uVar2);
  return;
}

Assistant:

void Entity::render_four(ALLEGRO_COLOR tint)
{
   int ox = 0;
   render(0, 0, tint);
   if (x > BB_W / 2) {
      ox = -BB_W;
      render(ox, 0, tint);
   }
   else {
      ox = BB_W;
      render(ox, 0, tint);
   }
   if (y > BB_H / 2) {
      render(0, -BB_H, tint);
      render(ox, -BB_H, tint);
   }
   else {
      render(0, BB_H, tint);
      render(ox, BB_H, tint);
   }
}